

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderErrors.cpp
# Opt level: O0

_compilation_result __thiscall
glcts::TessellationShaderError4InputVariables::getCompilationResult
          (TessellationShaderError4InputVariables *this,_pipeline_stage pipeline_stage)

{
  _pipeline_stage pipeline_stage_local;
  TessellationShaderError4InputVariables *this_local;
  
  this_local._4_4_ = (_compilation_result)(pipeline_stage == PIPELINE_STAGE_TESSELLATION_CONTROL);
  return this_local._4_4_;
}

Assistant:

TessellationShaderErrorsTestCaseBase::_compilation_result TessellationShaderError4InputVariables::getCompilationResult(
	_pipeline_stage pipeline_stage)
{
	/* Tessellation control shader is allowed to fail to compile,
	 * shaders for all other stages should compile successfully */
	switch (pipeline_stage)
	{
	case PIPELINE_STAGE_TESSELLATION_CONTROL:
		return COMPILATION_RESULT_CAN_FAIL;
	default:
		return COMPILATION_RESULT_MUST_SUCCEED;
	}
}